

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_client_transporter.cpp
# Opt level: O0

bool __thiscall
PipelineClientTransporter::Connect(PipelineClientTransporter *this,string *name,string *err)

{
  undefined8 req_00;
  bool bVar1;
  char *name_00;
  undefined1 local_878 [8];
  unique_lock<std::mutex> lock;
  uv_connect_t *req;
  size_t local_850;
  size_t len;
  char tmp [2048];
  string local_40 [8];
  string fullName;
  string *err_local;
  string *name_local;
  PipelineClientTransporter *this_local;
  
  fullName.field_2._8_8_ = err;
  std::__cxx11::string::string(local_40);
  local_850 = 0x800;
  uv_os_tmpdir((char *)&len,&local_850);
  std::__cxx11::string::operator=(local_40,(char *)&len);
  std::__cxx11::string::append((char *)local_40);
  std::__cxx11::string::append(local_40);
  (this->uvClient).data = this;
  lock._8_8_ = malloc(0x60);
  *(PipelineClientTransporter **)lock._8_8_ = this;
  uv_pipe_init((this->super_Transporter).loop,&this->uvClient,0);
  req_00 = lock._8_8_;
  name_00 = (char *)std::__cxx11::string::c_str();
  uv_pipe_connect((uv_connect_t *)req_00,&this->uvClient,name_00,onPipeConnectionCB);
  Transporter::StartEventLoop(&this->super_Transporter);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_878,&this->mutex);
  std::condition_variable::wait((unique_lock *)&this->cv);
  bVar1 = Transporter::IsConnected(&this->super_Transporter);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_878);
  std::__cxx11::string::~string(local_40);
  return bVar1;
}

Assistant:

bool PipelineClientTransporter::Connect(const std::string& name, std::string& err) {
	std::string fullName;
#ifdef _WIN32
	{
		fullName = "\\\\.\\pipe\\emmylua-";
		fullName.append(name);
	}
#else
	{
		char tmp[2048];
		size_t len = sizeof(tmp);
		uv_os_tmpdir(tmp, &len);
		fullName = tmp;
		fullName.append("/");
		fullName.append(name);
	}
#endif

	uvClient.data = this;
	const auto req = (uv_connect_t*)malloc(sizeof(uv_connect_t));
	req->data = this;
	uv_pipe_init(loop, &uvClient, 0);
	uv_pipe_connect(req, &uvClient, fullName.c_str(), onPipeConnectionCB);
	StartEventLoop();

	std::unique_lock<std::mutex> lock(mutex);
	cv.wait(lock);
	return IsConnected();
}